

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2test.c
# Opt level: O1

int pchars8(PCRE2_SPTR8 p,int length,BOOL utf,FILE *f)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  uint uVar6;
  int iVar7;
  uint32_t local_34 [2];
  uint32_t c;
  
  sVar5 = (size_t)(uint)length;
  local_34[0] = 0;
  if (length < 0) {
    sVar5 = strlen((char *)p);
  }
  iVar7 = 0;
  uVar6 = (uint)sVar5;
  do {
    if ((int)uVar6 < 1) {
      return iVar7;
    }
    iVar2 = (int)sVar5;
    uVar6 = iVar2 - 1;
    if (utf == 0) {
LAB_0010b1cd:
      bVar1 = *p;
      p = p + 1;
      local_34[0] = (uint32_t)bVar1;
      iVar4 = pchar(local_34[0],utf,f);
    }
    else {
      uVar3 = utf82ord(p,local_34);
      if (iVar2 < (int)uVar3 || (int)uVar3 < 1) goto LAB_0010b1cd;
      p = p + uVar3;
      iVar4 = pchar(local_34[0],utf,f);
      uVar6 = iVar2 - uVar3;
    }
    iVar7 = iVar7 + iVar4;
    sVar5 = (size_t)uVar6;
  } while( true );
}

Assistant:

static int pchars8(PCRE2_SPTR8 p, int length, BOOL utf, FILE *f)
{
uint32_t c = 0;
int yield = 0;
if (length < 0) length = strlen((char *)p);
while (length-- > 0)
  {
  if (utf)
    {
    int rc = utf82ord(p, &c);
    if (rc > 0 && rc <= length + 1)   /* Mustn't run over the end */
      {
      length -= rc - 1;
      p += rc;
      yield += pchar(c, utf, f);
      continue;
      }
    }
  c = *p++;
  yield += pchar(c, utf, f);
  }
return yield;
}